

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall diy::mpi::environment::environment(environment *this,int argc,char **argv)

{
  int argc_local;
  char **argv_local;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init_thread(&argc_local,&argv_local,1,this);
  return;
}

Assistant:

diy::mpi::environment::environment(int argc, char* argv[])
{
#if DIY_HAS_MPI
  MPI_Init_thread(&argc, &argv, MPI_THREAD_FUNNELED, &provided_threading);
#else
  (void) argc; (void) argv;
  provided_threading = MPI_THREAD_FUNNELED;
#endif
}